

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void Scrollbar(ImGuiWindow *window,bool horizontal)

{
  undefined8 *puVar1;
  ImGuiID IVar2;
  ImDrawList *this;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  ImU32 IVar13;
  uint uVar14;
  ImGuiContext *g;
  undefined7 extraout_var;
  long lVar15;
  ulong uVar16;
  undefined7 in_register_00000031;
  char *pcVar17;
  int iVar18;
  byte bVar19;
  uint uVar20;
  float fVar21;
  int iVar22;
  float fVar23;
  float fVar30;
  int iVar31;
  undefined1 auVar24 [16];
  int iVar32;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  float fVar44;
  bool hovered;
  bool held;
  bool local_126;
  bool local_125;
  float local_124;
  float local_120;
  int local_11c;
  ImRect local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ImRect local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ImVec4 local_a8;
  ImVec2 local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  
  pIVar10 = GImGui;
  local_f8._8_8_ = local_f8._0_8_;
  local_e8._8_8_ = local_e8._0_8_;
  uVar16 = CONCAT71(in_register_00000031,horizontal) & 0xffffffff;
  pcVar17 = "#SCROLLY";
  iVar22 = (int)CONCAT71(in_register_00000031,horizontal);
  if (iVar22 != 0) {
    pcVar17 = "#SCROLLX";
  }
  local_124 = (float)ImGuiWindow::GetID(window,pcVar17,(char *)0x0);
  bVar12 = (&window->ScrollbarX)[uVar16];
  local_d8 = 0.0;
  if (bVar12 == true) {
    local_d8 = (pIVar10->Style).ScrollbarSize;
  }
  fVar44 = (window->Pos).x;
  fVar23 = (window->Pos).y;
  fVar33 = (window->Size).x + fVar44;
  fVar21 = (window->Size).y + fVar23;
  fVar30 = window->BorderSize;
  if ((char)uVar16 == '\0') {
    local_c8.Min.x = fVar33 - (pIVar10->Style).ScrollbarSize;
    local_c8.Max.y = (fVar21 - local_d8) - fVar30;
    local_118.Min.x = local_c8.Min.x;
    local_118.Max.x = fVar33 - fVar30;
    local_118.Max.y = local_c8.Max.y;
    uVar14 = window->Flags;
    fVar21 = 0.0;
    fVar44 = 0.0;
    if ((uVar14 & 1) == 0) {
      fVar44 = (GImGui->Style).FramePadding.y;
      fVar44 = fVar44 + fVar44 + GImGui->FontBaseSize * window->FontWindowScale;
    }
    if ((uVar14 >> 10 & 1) != 0) {
      fVar21 = (GImGui->Style).FramePadding.y;
      fVar21 = fVar21 + fVar21 + GImGui->FontBaseSize * window->FontWindowScale;
    }
    local_e8._0_8_ = &(window->Size).y;
    local_c8.Min.y = fVar23 + fVar30 + fVar44 + fVar21;
    lVar15 = 0x1410;
    if ((uVar14 >> 0x14 & 1) == 0) {
      lVar15 = 0x1404;
    }
    local_118.Min.y = local_c8.Min.y;
    iVar18 = (~uVar14 >> 9 & -(uVar14 & 1) & 2) + (uint)(bVar12 ^ 1) * 4;
    local_c8.Max.x = fVar33 - fVar30;
    local_f8._0_8_ = 0x38;
  }
  else {
    local_e8._0_8_ = &window->Size;
    fVar33 = fVar33 - local_d8;
    auVar37._0_8_ = CONCAT44(fVar33,fVar21) << 0x20;
    auVar37._8_4_ = fVar33;
    auVar37._12_4_ = fVar21;
    auVar3._4_8_ = auVar37._8_8_;
    auVar3._0_4_ = fVar21 - (pIVar10->Style).ScrollbarSize;
    auVar24._0_8_ = auVar3._0_8_ << 0x20;
    auVar24._8_4_ = fVar33 - fVar30;
    auVar24._12_4_ = fVar21 - fVar30;
    local_118._4_12_ = auVar24._4_12_;
    local_118.Min.x = fVar44 + fVar30;
    lVar15 = 0x1410;
    if ((window->Flags & 0x100000) == 0) {
      lVar15 = 0x1404;
    }
    iVar18 = (uint)(bVar12 ^ 1) * 4 + 8;
    local_f8._0_8_ = 0x34;
    local_c8 = local_118;
  }
  local_108 = *(float *)((long)(pIVar10->IO).KeyMap + lVar15 + -0x34);
  this = window->DrawList;
  local_a8.x = (GImGui->Style).Colors[0xe].x;
  local_a8.y = (GImGui->Style).Colors[0xe].y;
  uVar6 = (GImGui->Style).Colors[0xe].z;
  uVar7 = (GImGui->Style).Colors[0xe].w;
  local_a8.w = (GImGui->Style).Alpha * (float)uVar7;
  local_a8.z = (float)uVar6;
  local_11c = iVar22;
  IVar13 = ImGui::ColorConvertFloat4ToU32(&local_a8);
  ImDrawList::AddRectFilled(this,&local_118.Min,&local_118.Max,IVar13,local_108,iVar18);
  fVar44 = local_124;
  iVar22 = (int)(((local_c8.Max.x - local_c8.Min.x) + -2.0) * 0.5);
  iVar18 = (int)(((local_c8.Max.y - local_c8.Min.y) + -2.0) * 0.5);
  iVar31 = (int)(((local_c8.Max.x - local_c8.Max.x) + 0.0) * 0.0);
  iVar32 = (int)(((local_c8.Max.y - local_c8.Max.y) + 0.0) * 0.0);
  auVar34._0_4_ = (float)iVar22;
  auVar34._4_4_ = (float)iVar18;
  auVar34._8_4_ = (float)iVar31;
  auVar34._12_4_ = (float)iVar32;
  auVar37 = minps(_DAT_0018e630,auVar34);
  auVar35._0_4_ = -(uint)(iVar22 < 0);
  auVar35._4_4_ = -(uint)(iVar18 < 0);
  auVar35._8_4_ = -(uint)(iVar31 < 0);
  auVar35._12_4_ = -(uint)(iVar32 < 0);
  auVar37 = ~auVar35 & auVar37;
  fVar23 = auVar37._0_4_;
  fStack_84 = auVar37._4_4_;
  auVar25._0_8_ = auVar37._0_8_;
  auVar25._8_4_ = fVar23;
  auVar25._12_4_ = fStack_84;
  local_108 = local_c8.Min.x + fVar23;
  fStack_104 = local_c8.Min.y + fStack_84;
  fStack_100 = local_c8.Max.x + fVar23;
  fStack_fc = local_c8.Max.y + fStack_84;
  local_c8.Min.y = local_c8.Min.y - fStack_84;
  local_c8.Max.x = local_c8.Max.x - fVar23;
  auVar9._4_4_ = local_c8.Max.x;
  auVar9._0_4_ = local_c8.Min.y;
  fStack_84 = local_c8.Max.y - fStack_84;
  auVar9._8_4_ = fStack_84;
  auVar4._4_8_ = auVar25._8_8_;
  auVar4._0_4_ = local_c8.Min.y;
  auVar26._0_8_ = auVar4._0_8_ << 0x20;
  auVar26._8_4_ = local_c8.Max.x;
  auVar26._12_4_ = fStack_84;
  local_118.Max = auVar26._8_8_;
  local_118.Min.y = fStack_104;
  local_118.Min.x = local_108;
  auVar5._4_4_ = local_118.Max.x;
  auVar5._8_4_ = local_118.Max.y;
  auVar5._0_4_ = local_c8.Min.y;
  auVar27._0_8_ = auVar5._0_8_ << 0x20;
  auVar27._8_4_ = local_c8.Max.x;
  auVar27._12_4_ = fStack_84;
  local_68._8_8_ = auVar9._4_8_;
  local_68._0_8_ = auVar27._8_8_;
  local_78._4_12_ = local_68._4_12_;
  local_78._0_4_ = local_c8.Max.x - local_108;
  local_c8.Min.y = fStack_84;
  local_c8.Min.x = fStack_84;
  local_c8.Max.x = fStack_84;
  local_c8.Max.y = fStack_84;
  local_88 = fStack_84 - fStack_104;
  bVar19 = (byte)local_11c;
  auVar28 = local_78;
  if (bVar19 == 0) {
    auVar28._4_4_ = fStack_84;
    auVar28._0_4_ = local_88;
    auVar28._8_4_ = fStack_84;
    auVar28._12_4_ = fStack_84;
  }
  local_120 = auVar28._0_4_;
  local_58 = ZEXT416(*(uint *)local_e8._0_8_);
  local_48 = ZEXT416(*(uint *)((long)&window->Name + local_f8._0_8_));
  local_e8 = ZEXT416((uint)(pIVar10->Style).GrabMinSize);
  local_f8 = ZEXT416((uint)(&(window->Scroll).x)[bVar19 ^ 1]);
  local_125 = false;
  local_126 = false;
  IVar2 = pIVar10->ActiveId;
  local_b8 = fStack_104;
  fStack_b4 = fStack_104;
  fStack_b0 = fStack_104;
  fStack_ac = fStack_104;
  fStack_80 = fStack_84;
  fStack_7c = fStack_84;
  bVar12 = ImGui::ButtonBehavior(&local_118,(ImGuiID)local_124,&local_126,&local_125,0);
  pIVar11 = GImGui;
  local_d8 = (float)local_58._0_4_ - local_d8;
  fVar23 = local_48._0_4_;
  fVar30 = local_48._4_4_;
  auVar40._4_12_ = local_48._4_12_;
  auVar40._0_4_ = fVar23 - local_d8;
  auVar42._0_8_ = auVar40._0_8_;
  auVar42._8_4_ = fVar30;
  auVar42._12_4_ = local_58._4_4_;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._4_4_ = local_d8;
  auVar41._0_4_ = auVar40._0_4_;
  auVar36._0_8_ =
       CONCAT44((uint)fVar23 & -(uint)(local_d8 <= fVar23),-(uint)(auVar40._0_4_ <= 1.0)) &
       0xffffffff3f800000;
  auVar36._8_4_ = 0;
  auVar36._12_4_ = (uint)fVar30 & -(uint)((float)local_58._4_4_ <= fVar30);
  auVar29._0_4_ = ~-(uint)(auVar40._0_4_ <= 1.0) & (uint)auVar40._0_4_;
  auVar29._4_4_ = ~-(uint)(local_d8 <= fVar23) & (uint)local_d8;
  auVar29._8_4_ = ~-(uint)(fVar30 <= 0.0) & (uint)fVar30;
  auVar29._12_4_ = ~-(uint)((float)local_58._4_4_ <= fVar30) & local_58._4_4_;
  auVar43._4_12_ = auVar41._4_12_;
  auVar43._0_4_ = local_f8._0_4_;
  auVar37 = divps(auVar43,auVar29 | auVar36);
  fVar30 = auVar37._0_4_;
  fVar21 = auVar37._4_4_;
  iVar22 = -(uint)(fVar30 < 0.0);
  iVar18 = -(uint)(fVar21 < 0.0);
  auVar39._4_4_ = iVar18;
  auVar39._0_4_ = iVar22;
  auVar39._8_4_ = iVar18;
  auVar39._12_4_ = iVar18;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._4_4_ = iVar22;
  auVar38._0_4_ = iVar22;
  uVar14 = movmskpd((int)CONCAT71(extraout_var,bVar12),auVar38);
  fVar23 = 0.0;
  if (((uVar14 & 2) == 0) && (fVar23 = 1.0, fVar21 <= 1.0)) {
    fVar23 = fVar21;
  }
  uVar20 = -(uint)((float)local_e8._0_4_ <= fVar23 * local_120);
  local_d8 = (float)(~uVar20 & local_e8._0_4_ | (uint)(fVar23 * local_120) & uVar20);
  if (local_120 <= local_d8) {
    local_d8 = local_120;
  }
  fVar21 = local_d8 / local_120;
  fVar23 = 0.0;
  if (((uVar14 & 1) == 0) && (fVar23 = 1.0, fVar30 <= 1.0)) {
    fVar23 = fVar30;
  }
  local_124 = (fVar23 * (local_120 - local_d8)) / local_120;
  uStack_d4 = 0;
  uStack_d0 = 0;
  uStack_cc = 0;
  if (1.0 <= fVar21 || local_125 != true) goto LAB_0013b0de;
  fVar23 = local_108;
  if (bVar19 == 0) {
    fVar23 = local_b8;
  }
  lVar15 = (ulong)(bVar19 ^ 1) * 4;
  fVar30 = (*(float *)((pIVar10->IO).MouseDown + lVar15 + -8) - fVar23) / local_120;
  fVar23 = 1.0;
  if (fVar30 <= 1.0) {
    fVar23 = fVar30;
  }
  fVar23 = (float)(~-(uint)(fVar30 < 0.0) & (uint)fVar23);
  GImGui->HoveredId = (ImGuiID)fVar44;
  pIVar11->HoveredIdAllowOverlap = false;
  if ((float)IVar2 == fVar44) {
    fVar44 = *(float *)(pIVar10->Tooltip + lVar15 + -8);
LAB_0013b02f:
    bVar12 = false;
  }
  else {
    if ((local_124 <= fVar23) && (fVar23 <= fVar21 + local_124)) {
      fVar44 = fVar21 * -0.5 + (fVar23 - local_124);
      *(float *)(pIVar10->Tooltip + lVar15 + -8) = fVar44;
      goto LAB_0013b02f;
    }
    pcVar17 = pIVar10->Tooltip + lVar15 + -8;
    pcVar17[0] = '\0';
    pcVar17[1] = '\0';
    pcVar17[2] = '\0';
    pcVar17[3] = '\0';
    bVar12 = true;
    fVar44 = 0.0;
  }
  fVar30 = ((fVar23 - fVar44) - fVar21 * 0.5) / (1.0 - fVar21);
  fVar44 = 1.0;
  if (fVar30 <= 1.0) {
    fVar44 = fVar30;
  }
  fVar33 = SUB164(auVar29 | auVar36,0);
  fVar44 = (float)(int)((float)(~-(uint)(fVar30 < 0.0) & (uint)fVar44) * fVar33 + 0.5);
  if (bVar19 == 0) {
    (window->Scroll).y = fVar44;
  }
  else {
    (window->Scroll).x = fVar44;
  }
  fVar44 = fVar44 / fVar33;
  fVar30 = 1.0;
  if (fVar44 <= 1.0) {
    fVar30 = fVar44;
  }
  local_124 = ((local_120 - local_d8) * (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar30)) / local_120;
  if (bVar12) {
    *(float *)(pIVar10->Tooltip + lVar15 + -8) = -fVar21 * 0.5 + (fVar23 - local_124);
  }
LAB_0013b0de:
  iVar22 = 0x11;
  if (local_125 == false) {
    iVar22 = (local_126 & 1) + 0xf;
  }
  puVar1 = (undefined8 *)((long)&(pIVar11->Style).Colors[0].x + (ulong)(uint)(iVar22 << 4));
  local_a8._0_8_ = *puVar1;
  uVar8 = puVar1[1];
  local_a8.w = (float)((ulong)uVar8 >> 0x20);
  local_a8.z = (float)uVar8;
  local_a8.w = (pIVar11->Style).Alpha * local_a8.w;
  IVar13 = ImGui::ColorConvertFloat4ToU32(&local_a8);
  if (bVar19 == 0) {
    local_a8.y = local_88 * local_124 + local_b8;
    local_a8.x = local_108;
    local_90.y = local_d8 + local_a8.y;
    local_90.x = (float)local_68._0_4_;
  }
  else {
    local_a8.x = (float)local_78._0_4_ * local_124 + local_108;
    local_a8.y = local_b8;
    local_90.x = local_d8 + local_a8.x;
    local_90.y = local_c8.Min.x;
  }
  ImDrawList::AddRectFilled
            (window->DrawList,(ImVec2 *)&local_a8,&local_90,IVar13,
             (pIVar10->Style).ScrollbarRounding,0xf);
  return;
}

Assistant:

static void Scrollbar(ImGuiWindow* window, bool horizontal)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->BorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);

    float window_rounding = (window->Flags & ImGuiWindowFlags_ChildWindow) ? style.ChildWindowRounding : style.WindowRounding;
    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = 8 | (other_scrollbar ? 0 : 4);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? 2 : 0) | (other_scrollbar ? 0 : 4);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, ImGui::GetColorU32(ImGuiCol_ScrollbarBg), window_rounding, window_rounding_corners);
    bb.Reduce(ImVec2(ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main axis of the scrollbar
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->Size.x : window->Size.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // The grabable box size generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    const float grab_h_pixels = ImMin(ImMax(scrollbar_size_v * ImSaturate(win_size_avail_v / ImMax(win_size_contents_v, win_size_avail_v)), style.GrabMinSize), scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ImGui::ButtonBehavior(bb, id, &hovered, &held);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        ImGui::SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = ImGui::GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    if (horizontal)
        window->DrawList->AddRectFilled(ImVec2(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y), ImVec2(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y), grab_col, style.ScrollbarRounding);
    else
        window->DrawList->AddRectFilled(ImVec2(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm)), ImVec2(bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels), grab_col, style.ScrollbarRounding);
}